

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::CssUrlEscape::Modify
          (CssUrlEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (inlen != 0) {
    sVar2 = 0;
    do {
      bVar1 = in[sVar2];
      if (0x3b < bVar1) {
        if (bVar1 == 0x3c) {
          pcVar3 = "%3C";
        }
        else if (bVar1 == 0x3e) {
          pcVar3 = "%3E";
        }
        else {
          if (bVar1 != 0x5c) goto switchD_0012ad85_caseD_23;
          pcVar3 = "%5C";
        }
        goto LAB_0012ae64;
      }
      switch(bVar1) {
      case 0x22:
        pcVar3 = "%22";
        break;
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
switchD_0012ad85_caseD_23:
        (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)(char)bVar1);
        goto LAB_0012ae67;
      case 0x27:
        pcVar3 = "%27";
        break;
      case 0x28:
        pcVar3 = "%28";
        break;
      case 0x29:
        pcVar3 = "%29";
        break;
      case 0x2a:
        pcVar3 = "%2A";
        break;
      default:
        if (bVar1 == 10) {
          pcVar3 = "%0A";
        }
        else {
          if (bVar1 != 0xd) goto switchD_0012ad85_caseD_23;
          pcVar3 = "%0D";
        }
      }
LAB_0012ae64:
      (*out->_vptr_ExpandEmitter[5])(out,pcVar3,3);
LAB_0012ae67:
      sVar2 = sVar2 + 1;
    } while (inlen != sVar2);
  }
  return;
}

Assistant:

void CssUrlEscape::Modify(const char* in, size_t inlen,
                          const PerExpandData*,
                          ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '\n': APPEND("%0A"); break;
      case '\r': APPEND("%0D"); break;
      case '"':  APPEND("%22"); break;
      case '\'': APPEND("%27"); break;
      case '(':  APPEND("%28"); break;
      case ')':  APPEND("%29"); break;
      case '*':  APPEND("%2A"); break;
      case '<':  APPEND("%3C"); break;
      case '>':  APPEND("%3E"); break;
      case '\\': APPEND("%5C"); break;
      default: out->Emit(c); break;
    }
  }
}